

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O0

word zzMulW(word *b,word *a,size_t n,word w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t i;
  dword prod;
  word carry;
  word w_local;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  carry = 0;
  for (i = 0; auVar3._8_8_ = 0, auVar3._0_8_ = carry, i < n; i = i + 1) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = w;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = a[i];
    auVar3 = auVar1 * auVar2 + auVar3;
    carry = auVar3._8_8_;
    b[i] = auVar3._0_8_;
  }
  return carry;
}

Assistant:

word zzMulW(word b[], const word a[], size_t n, register word w)
{
	register word carry = 0;
	register dword prod;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
		zzMul11(prod, w, a[i]);
		prod += carry;
		b[i] = (word)prod;
		carry = (word)(prod >> B_PER_W);
	}
	prod = 0, w = 0;
	return carry;
}